

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex_socket.cpp
# Opt level: O0

SOCKET Socket_CreateLargeMultiCast(in_addr MyAddress,unsigned_short MyPort,in_addr MultiCastAddress)

{
  uint16_t uVar1;
  int iVar2;
  char *pcVar3;
  uint32_t in_EDX;
  uint16_t in_SI;
  int iTmp;
  ip_mreqn stMreq;
  sockaddr_in my_addr;
  int retval;
  SOCKET MySocket;
  undefined8 in_stack_ffffffffffffffb8;
  int size;
  SOCKET in_stack_ffffffffffffffc0;
  undefined4 local_3c;
  uint32_t local_38 [3];
  in_addr_t local_2c;
  undefined1 local_28 [4];
  in_addr_t local_24;
  int local_18;
  int local_14;
  uint16_t local_e;
  uint32_t local_c;
  SOCKET local_4;
  
  size = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_e = in_SI;
  local_c = in_EDX;
  local_14 = socket(2,2,0);
  memset(local_28,0,0x10);
  local_28._0_2_ = 2;
  local_28._2_2_ = htons(local_e);
  local_24 = 0;
  iVar2 = bind(local_14,(sockaddr *)local_28,0x10);
  if (iVar2 == -1) {
    local_2c = local_24;
    pcVar3 = inet_ntoa((in_addr)local_24);
    uVar1 = ntohs(local_28._2_2_);
    LogMessage(1,"%s: bind() failed, address %s, port %d",
               "SOCKET Socket_CreateLargeMultiCast(in_addr, unsigned short, in_addr)",pcVar3,
               (ulong)uVar1);
    ProcessSocketError();
    close(local_14);
    local_4 = -1;
  }
  else {
    local_38[0] = htonl(local_c);
    local_38[1] = 0;
    local_38[2] = 0;
    local_18 = setsockopt(local_14,0,0x23,local_38,0xc);
    if (local_18 == -1) {
      LogMessage(1,"%s: Joining the multicast group failed",
                 "SOCKET Socket_CreateLargeMultiCast(in_addr, unsigned short, in_addr)");
      ProcessSocketError();
      close(local_14);
      local_4 = -1;
    }
    else {
      local_3c = 2;
      local_18 = setsockopt(local_14,0,0x21,&local_3c,4);
      if (local_18 == -1) {
        ProcessSocketError();
      }
      setReceiveBufferSize(in_stack_ffffffffffffffc0,size);
      local_4 = local_14;
    }
  }
  return local_4;
}

Assistant:

SOCKET Socket_CreateLargeMultiCast(in_addr MyAddress, // not used
                                   unsigned short MyPort,
                                   in_addr MultiCastAddress // standard byte order (not network byte order)
                                   )
{
  SOCKET MySocket;
  int retval;

  // Get a datagram socket

  MySocket = socket(PF_INET, SOCK_DGRAM, 0);

  // "A socket must bind to an address before calling setsockopt"

  struct sockaddr_in my_addr;

  memset(&my_addr, 0, sizeof(my_addr));
  my_addr.sin_family = AF_INET;
  my_addr.sin_port = htons(MyPort);
  //my_addr.sin_addr.s_addr = inet_addr(szMyAddress); //INADDR_ANY;
  my_addr.sin_addr.s_addr = INADDR_ANY;//MyAddress.s_addr;

  if (bind(MySocket, (struct sockaddr *) &my_addr, sizeof(struct sockaddr))
      == SOCKET_ERROR) {
    LogMessage(VL_Error, "%s: bind() failed, address %s, port %d", __PRETTY_FUNCTION__, inet_ntoa(my_addr.sin_addr), ntohs(my_addr.sin_port));
    ProcessSocketError();
    close(MySocket);
    return -1;
  }

  // Join the multicast group
  // Note: This is NOT necessary for the host program.

  struct ip_mreqn stMreq;

  //stMreq.imr_multiaddr.s_addr = inet_addr(szMultiCastAddress);
  //stMreq.imr_interface.s_addr = inet_addr(szMyAddress);
  stMreq.imr_multiaddr.s_addr = htonl(MultiCastAddress.s_addr);
//  stMreq.imr_interface = MyAddress;
  stMreq.imr_address.s_addr = INADDR_ANY;
  stMreq.imr_ifindex = 0;
  retval = setsockopt(MySocket, IPPROTO_IP, IP_ADD_MEMBERSHIP,
                      (char *) &stMreq, sizeof(ip_mreqn));
  if (retval == SOCKET_ERROR) {
    LogMessage(VL_Error, "%s: Joining the multicast group failed", __PRETTY_FUNCTION__);
    ProcessSocketError();
    close(MySocket);
    return -1;
  }

  // Set TTL to traverse multiple routers (test)
  // The default is 1 which means direct connections only.  No routers.

  int iTmp;

  iTmp = 2;
  retval = setsockopt(MySocket, IPPROTO_IP, IP_MULTICAST_TTL, (char *) &iTmp,
                      sizeof(iTmp));
  if (retval == SOCKET_ERROR) {
    ProcessSocketError();
  }

  setReceiveBufferSize(MySocket, 0x100000);

  // Disable loopback
#if 0
  iTmp = 0;
  retval = setsockopt(MySocket, IPPROTO_IP, IP_MULTICAST_LOOP, (char *)&iTmp, sizeof(iTmp));
  if (retval == SOCKET_ERROR)
  {
    ProcessSocketError();
  }
#endif

  // If you want the MultiCast to go out through more than one ethernet card...
#if 0
  unsigned long addr = inet_addr(IP_Address);
  retval = setsockopt(MySocket, IPPROTO_IP, IP_MULTICAST_IF, (char *)&addr, sizeof(addr));
#endif

  // Send and Receive examples

#if 0
  // Configure an address for sendto

  memset(&m_stTo, 0, sizeof(sockaddr_in));
  m_stTo.sin_family = AF_INET;
  m_stTo.sin_addr.s_addr = inet_addr(szMultiCastAddress);
  m_stTo.sin_port = htons(MultiCastPort);
#endif

#if 0
  retval = sendto(MySocket, "multicast message", 20, 0, (struct sockaddr *)&m_stTo, sizeof(m_stTo));

  // Receiving message example

  len = sizeof(stFrom);
  recvfrom(MySocket, achIn, BUFSIZE, 0, (struct sockaddr *)&stFrom, &len);

  // Exit multicast group

  //stMreq.imr_multiaddr.s_addr = inet_addr("224,1,2,4");
  //stMreq.imr_interface.s_addr = netstatic[0].n_ipaddr;

  retval = setsockopt(MySocket, IPPROTO_IP, IP_DROP_MEMBERSHIP, (char *)&stMreq, sizeof(stMreq));

  retval = close(MySocket);
#endif

  return MySocket;
}